

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall soplex::SPxLPBase<double>::doRemoveRows(SPxLPBase<double> *this,int *perm)

{
  int iVar1;
  Item *pIVar2;
  Nonzero<double> *pNVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  lVar9 = (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  LPRowSetBase<double>::remove(&this->super_LPRowSetBase<double>,(char *)perm);
  if (0 < lVar9) {
    lVar5 = 0;
    do {
      pIVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar5].idx;
      uVar6 = (ulong)pIVar2[iVar1].data.super_SVectorBase<double>.memused;
      if (0 < (long)uVar6) {
        pIVar2 = pIVar2 + iVar1;
        lVar7 = uVar6 * 0x10 + -8;
        do {
          pNVar3 = (pIVar2->data).super_SVectorBase<double>.m_elem;
          if (perm[*(int *)((long)&pNVar3->val + lVar7)] < 0) {
            iVar1 = (pIVar2->data).super_SVectorBase<double>.memused;
            uVar8 = iVar1 - 1;
            (pIVar2->data).super_SVectorBase<double>.memused = uVar8;
            if ((long)uVar6 < (long)iVar1) {
              *(int *)((long)&pNVar3->val + lVar7) = pNVar3[uVar8].idx;
              *(double *)((long)pNVar3 + lVar7 + -8) = pNVar3[uVar8].val;
            }
          }
          else {
            *(int *)((long)&pNVar3->val + lVar7) = perm[*(int *)((long)&pNVar3->val + lVar7)];
          }
          lVar7 = lVar7 + -0x10;
          bVar4 = 1 < uVar6;
          uVar6 = uVar6 - 1;
        } while (bVar4);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar9);
  }
  return;
}

Assistant:

virtual void doRemoveRows(int perm[])
   {
      int j = nCols();

      LPRowSetBase<R>::remove(perm);

      for(int i = 0; i < j; ++i)
      {
         SVectorBase<R>& vec = colVector_w(i);

         for(int k = vec.size() - 1; k >= 0; --k)
         {
            int idx = vec.index(k);

            if(perm[idx] < 0)
               vec.remove(k);
            else
               vec.index(k) = perm[idx];
         }
      }
   }